

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O2

char * google::protobuf::internal::TcParser::
       MessageSetWireFormatParseLoopImpl<google::protobuf::Message>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ExtensionSet *this;
  char *pcVar1;
  
  this = RefAt<google::protobuf::internal::ExtensionSet>(msg,(ulong)table->extension_offset);
  pcVar1 = ExtensionSet::ParseMessageSet<google::protobuf::Message>
                     (this,ptr,(Message *)table->class_data->prototype,&msg->_internal_metadata_,ctx
                     );
  return pcVar1;
}

Assistant:

PROTOBUF_CC static const char* MessageSetWireFormatParseLoopImpl(
      PROTOBUF_TC_PARAM_NO_DATA_DECL) {
    return RefAt<ExtensionSet>(msg, table->extension_offset)
        .ParseMessageSet(
            ptr, static_cast<const MessageBaseT*>(table->default_instance()),
            &msg->_internal_metadata_, ctx);
  }